

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::SharedPtr
          (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> *this,Expr<bool> *ptr)

{
  Expr<bool> *pEVar1;
  SharedPtrState<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>_>
  *pSVar2;
  DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> local_25 [13];
  Expr<bool> *local_18;
  Expr<bool> *ptr_local;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> *this_local;
  
  this->m_ptr = (Expr<bool> *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Expr<bool> *)this;
  pSVar2 = (SharedPtrState<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>_>
            *)operator_new(0x20);
  pEVar1 = local_18;
  DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::DefaultDeleter(local_25);
  SharedPtrState<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>_>
  ::SharedPtrState(pSVar2,pEVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}